

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelExtractor.h
# Opt level: O2

void __thiscall
hiberlite::ExtractModel::notifyInitWalk<hiberlite::AVisitor<hiberlite::ExtractModel>>
          (ExtractModel *this,AVisitor<hiberlite::ExtractModel> *av)

{
  mapped_type *this_00;
  key_type kStack_e8;
  string local_c8 [32];
  Scope local_a8;
  Scope local_60;
  
  Scope::Scope(&local_60,&av->scope);
  std::__cxx11::string::string(local_c8,(string *)&local_60);
  Scope::Scope(&local_a8,&av->scope);
  std::__cxx11::string::string((string *)&kStack_e8,(string *)&local_a8);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hiberlite::Table>_>_>
                          *)this,&kStack_e8);
  std::__cxx11::string::operator=((string *)this_00,local_c8);
  std::__cxx11::string::~string((string *)&kStack_e8);
  Scope::~Scope(&local_a8);
  std::__cxx11::string::~string(local_c8);
  Scope::~Scope(&local_60);
  return;
}

Assistant:

inline void notifyInitWalk(AV& av){
			model[av.getScope().table()].name=av.getScope().table();
		}